

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

Node * __thiscall wasm::DataFlow::Graph::doVisitLocalSet(Graph *this,LocalSet *curr)

{
  mapped_type pEVar1;
  bool bVar2;
  mapped_type *ppEVar3;
  Node *pNVar4;
  mapped_type *ppNVar5;
  reference ppNVar6;
  mapped_type *ppEVar7;
  _Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>,_false> local_40;
  _Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>,_false> local_38;
  Node *local_30;
  Node *node;
  Node *local_20;
  LocalSet *curr_local;
  Graph *this_local;
  
  local_20 = (Node *)curr;
  curr_local = (LocalSet *)this;
  bVar2 = isRelevantLocal(this,curr->index);
  if ((bVar2) && (bVar2 = isInUnreachable(this), !bVar2)) {
    bVar2 = wasm::Type::isConcrete
                      (&((Expression *)
                        (local_20->values).
                        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_start)->type);
    if (!bVar2) {
      __assert_fail("curr->value->type.isConcrete()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/dataflow/graph.h"
                    ,0x195,"Node *wasm::DataFlow::Graph::doVisitLocalSet(LocalSet *)");
    }
    std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::push_back
              (&this->sets,(value_type *)&local_20);
    pEVar1 = this->parent;
    node = local_20;
    ppEVar3 = std::
              unordered_map<wasm::Expression_*,_wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>_>
              ::operator[](&this->expressionParentMap,(key_type *)&node);
    pNVar4 = local_20;
    *ppEVar3 = pEVar1;
    ppEVar3 = std::
              unordered_map<wasm::Expression_*,_wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>_>
              ::operator[](&this->expressionParentMap,(key_type *)&local_20->values);
    *ppEVar3 = (mapped_type)pNVar4;
    pNVar4 = Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                       ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,
                        (Expression *)
                        (local_20->values).
                        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    local_30 = pNVar4;
    ppNVar5 = std::
              unordered_map<wasm::LocalSet_*,_wasm::DataFlow::Node_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_wasm::DataFlow::Node_*>_>_>
              ::operator[](&this->setNodeMap,(key_type *)&local_20);
    *ppNVar5 = pNVar4;
    ppNVar6 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::
              operator[](&this->locals,(ulong)*(uint *)&local_20->origin);
    *ppNVar6 = pNVar4;
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::DataFlow::Node_*,_wasm::Expression_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>_>_>
         ::find(&this->nodeParentMap,&local_30);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::DataFlow::Node_*,_wasm::Expression_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>_>_>
         ::end(&this->nodeParentMap);
    bVar2 = std::__detail::operator==(&local_38,&local_40);
    pNVar4 = local_20;
    if (bVar2) {
      ppEVar7 = std::
                unordered_map<wasm::DataFlow::Node_*,_wasm::Expression_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>_>_>
                ::operator[](&this->nodeParentMap,&local_30);
      *ppEVar7 = (mapped_type)pNVar4;
    }
  }
  return &this->bad;
}

Assistant:

Node* doVisitLocalSet(LocalSet* curr) {
    if (!isRelevantLocal(curr->index) || isInUnreachable()) {
      return &bad;
    }
    assert(curr->value->type.isConcrete());
    sets.push_back(curr);
    expressionParentMap[curr] = parent;
    expressionParentMap[curr->value] = curr;
    // Set the current node in the local state.
    auto* node = visit(curr->value);
    locals[curr->index] = setNodeMap[curr] = node;
    // If we created a new node (and not just did a get of a set, which
    // passes around an existing node), mark its parent.
    if (nodeParentMap.find(node) == nodeParentMap.end()) {
      nodeParentMap[node] = curr;
    }
    return &bad;
  }